

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O2

void __thiscall cppcms::impl::cgi::fastcgi::on_start_request(fastcgi *this,error_code *e,handler *h)

{
  uchar uVar1;
  ushort uVar2;
  pointer pcVar3;
  ushort *puVar4;
  ushort *puVar5;
  uint *puVar6;
  bool bVar7;
  bool bVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint uVar9;
  allocator local_259;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> local_258;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> local_250;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> local_248;
  locale l;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pairs;
  undefined1 local_220 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_200 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f0;
  string name;
  string local_1c8;
  ostringstream ss;
  undefined3 uStack_1a7;
  
  if (e->_M_value != 0) {
    booster::callback<void_(const_std::error_code_&)>::operator()(h,e);
    return;
  }
  if ((this->header_).version == '\x01') {
    uVar1 = (this->header_).type;
    if (uVar1 != '\x01') {
      if (uVar1 != '\t') {
        (*(this->super_connection)._vptr_connection[0xf])(this,h);
        return;
      }
      (this->header_).type = '\n';
      pairs.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pairs.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pairs.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::reserve(&pairs,4);
      bVar7 = parse_pairs(this,&pairs);
      if (bVar7) {
        pcVar3 = (this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish != pcVar3) {
          (this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = pcVar3;
        }
        std::locale::locale(&l,"C");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        std::ios::imbue((locale *)(local_220 + 0x10));
        std::locale::~locale((locale *)(local_220 + 0x10));
        std::ostream::operator<<(&ss,this->cuncurrency_hint_);
        for (uVar9 = 0;
            (ulong)uVar9 <
            (ulong)((long)pairs.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)pairs.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 6); uVar9 = uVar9 + 1) {
          std::__cxx11::string::string
                    ((string *)&name,
                     (string *)
                     (pairs.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar9));
          bVar8 = std::operator==(&name,"FCGI_MAX_CONNS");
          if ((bVar8) || (bVar8 = std::operator==(&name,"FCGI_MAX_REQS"), bVar8)) {
            std::__cxx11::stringbuf::str();
            add_pair(this,&name,&local_1c8);
LAB_00256f76:
            std::__cxx11::string::~string((string *)&local_1c8);
          }
          else {
            bVar8 = std::operator==(&name,"FCGI_MPXS_CONNS");
            if (bVar8) {
              std::__cxx11::string::string((string *)&local_1c8,"0",&local_259);
              add_pair(this,&name,&local_1c8);
              goto LAB_00256f76;
            }
          }
          std::__cxx11::string::~string((string *)&name);
        }
        self((fastcgi *)local_220);
        mfunc_to_event_handler<cppcms::impl::cgi::fastcgi,std::shared_ptr<cppcms::impl::cgi::fastcgi>,booster::callback<void(std::error_code_const&)>const&,booster::callback<void(std::error_code_const&)>>
                  ((offset_in_fastcgi_to_subr)&local_248,
                   (shared_ptr<cppcms::impl::cgi::fastcgi> *)on_params_response_sent,
                   (callback<void_(const_std::error_code_&)> *)0x0);
        booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::intrusive_ptr
                  ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&name,
                   &local_248);
        async_send_respnse(this,(handler *)&name);
        booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                  ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&name);
        booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                  (&local_248);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_220 + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
        std::locale::~locale(&l);
      }
      else {
        _ss = 1;
        booster::callback<void_(const_std::error_code_&)>::operator()(h,(error_code *)&ss);
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&pairs);
      if (!bVar7) {
        return;
      }
    }
    puVar4 = (ushort *)
             (this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (ushort *)
             (this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)puVar5 - (long)puVar4 == 8) {
      uVar2 = *puVar4;
      *puVar4 = uVar2 << 8 | uVar2 >> 8;
      this->keep_alive_ = (bool)((byte)puVar4[1] & 1);
      if (uVar2 == 0x100) {
        this->request_id_ = (uint)(this->header_).request_id;
        if (puVar5 != puVar4) {
          (this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)puVar4;
        }
        bVar7 = non_blocking_read_record(this);
        if (bVar7) {
          _ss = 0;
          std::_V2::system_category();
          params_record_expected(this,(error_code *)&ss,h);
          return;
        }
        self((fastcgi *)(local_220 + 0x18));
        mfunc_to_event_handler<cppcms::impl::cgi::fastcgi,std::shared_ptr<cppcms::impl::cgi::fastcgi>,booster::callback<void(std::error_code_const&)>const&,booster::callback<void(std::error_code_const&)>>
                  ((offset_in_fastcgi_to_subr)&local_258,
                   (shared_ptr<cppcms::impl::cgi::fastcgi> *)params_record_expected,
                   (callback<void_(const_std::error_code_&)> *)0x0);
        booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::intrusive_ptr
                  ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&ss,
                   &local_258);
        async_read_record(this,(handler *)&ss);
        booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                  ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&ss);
        booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                  (&local_258);
        this_00 = local_200;
      }
      else {
        (this->header_).type = '\x03';
        _ss = CONCAT31(uStack_1a7,8);
        std::vector<char,_std::allocator<char>_>::_M_fill_assign
                  (&this->body_,0,(value_type_conflict *)&ss);
        puVar6 = (uint *)(this->body_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
        *(undefined1 *)(puVar6 + 1) = 3;
        uVar9 = *puVar6;
        *puVar6 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
        self((fastcgi *)(local_200 + 1));
        mfunc_to_event_handler<cppcms::impl::cgi::fastcgi,std::shared_ptr<cppcms::impl::cgi::fastcgi>,booster::callback<void(std::error_code_const&)>const&,booster::callback<void(std::error_code_const&)>>
                  ((offset_in_fastcgi_to_subr)&local_250,
                   (shared_ptr<cppcms::impl::cgi::fastcgi> *)on_params_response_sent,
                   (callback<void_(const_std::error_code_&)> *)0x0);
        booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::intrusive_ptr
                  ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&ss,
                   &local_250);
        async_send_respnse(this,(handler *)&ss);
        booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                  ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&ss);
        booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                  (&local_250);
        this_00 = &local_1f0;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
      return;
    }
  }
  _ss = 1;
  booster::callback<void_(const_std::error_code_&)>::operator()(h,(error_code *)&ss);
  return;
}

Assistant:

void on_start_request(booster::system::error_code const &e,handler const &h)
		{
			if(e) {
				h(e);
				return;
			}
			if(header_.version!=fcgi_version_1)
			{
				h(booster::system::error_code(errc::protocol_violation,cppcms_category));
				return;
			}
			if(header_.type==fcgi_get_values) {
				header_.type = fcgi_get_values_result;
				std::vector<std::pair<std::string,std::string> > pairs;
				pairs.reserve(4);
				if(!parse_pairs(pairs)) {
					h(booster::system::error_code(errc::protocol_violation,cppcms_category));
					return;
				}
				body_.clear();
				std::locale l("C");
				std::ostringstream ss;
				ss.imbue(l);
				ss<<cuncurrency_hint_;
				for(unsigned i=0;i<pairs.size();i++) {
					std::string name=pairs[i].first;
					if(name=="FCGI_MAX_CONNS" || name=="FCGI_MAX_REQS")
						add_pair(name,ss.str());
					else if(name=="FCGI_MPXS_CONNS")
						add_pair(name,"0");
				}
				async_send_respnse(mfunc_to_event_handler(&fastcgi::on_params_response_sent,
								self(),
								h));
			}
			else if(header_.type!=fcgi_begin_request) {
				async_read_headers(h);
				return;
			}
			
			if(body_.size()!=sizeof(fcgi_request_body)) {
				h(booster::system::error_code(errc::protocol_violation,cppcms_category));
				return;
			}
			fcgi_request_body *body=reinterpret_cast<fcgi_request_body*>(&body_.front());
			body->to_host();
			keep_alive_=body->flags & fcgi_keep_conn;
			
			if(body->role!=fcgi_responder) {
				header_.type=fcgi_end_request;
				body_.assign(0,8);
				fcgi_end_request_body *body=reinterpret_cast<fcgi_end_request_body*>(&body_.front());
				body->protocol_status=fcgi_unknown_role;
				body->to_net();
				async_send_respnse(mfunc_to_event_handler(&fastcgi::on_params_response_sent,
								self(),
								h));
				return;
			}
			request_id_=header_.request_id;
			
			body_.clear();
			if(non_blocking_read_record()) {
				params_record_expected(booster::system::error_code(),h);
			}
			else {
				async_read_record(mfunc_to_event_handler(&fastcgi::params_record_expected,self(),h));
			}
		}